

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pullpush.c
# Opt level: O0

uint64_t pull_varint(uchar **cursor,size_t *max)

{
  size_t sVar1;
  uint64_t local_30;
  uint64_t v;
  undefined1 auStack_20 [7];
  uchar buf [9];
  size_t *max_local;
  uchar **cursor_local;
  
  buf._1_8_ = max;
  pull_bytes((void *)((long)&v + 7),1,cursor,max);
  sVar1 = varint_length_from_bytes((uchar *)((long)&v + 7));
  pull_bytes(auStack_20,sVar1 - 1,cursor,(size_t *)buf._1_8_);
  varint_from_bytes((uchar *)((long)&v + 7),&local_30);
  return local_30;
}

Assistant:

uint64_t pull_varint(const unsigned char **cursor, size_t *max)
{
    unsigned char buf[sizeof(uint8_t) + sizeof(uint64_t)];
    uint64_t v;

    /* FIXME: Would be more efficient to opencode varint here! */
    pull_bytes(buf, 1, cursor, max);
    pull_bytes(buf + 1, varint_length_from_bytes(buf) - 1, cursor, max);
    varint_from_bytes(buf, &v);

    return v;
}